

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

int Cudd_zddVarsFromBddVars(DdManager *dd,int multiplicity)

{
  DdNode **ppDVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int *piVar5;
  MtrNode *treenode;
  char *vmask;
  char *lmask;
  int *piVar6;
  size_t __size;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (multiplicity < 1) {
    return 0;
  }
  iVar4 = dd->sizeZ;
  iVar7 = dd->size * multiplicity;
  if ((iVar4 < iVar7) && (iVar7 = cuddResizeTableZdd(dd,iVar7 + -1), iVar7 == 0)) {
    return 0;
  }
  if (iVar4 == 0) {
    if (0 < dd->size) {
      uVar8 = (ulong)(uint)multiplicity;
      piVar5 = dd->perm;
      piVar6 = dd->permZ;
      piVar10 = dd->invpermZ;
      lVar9 = 0;
      lVar12 = 0;
      do {
        uVar13 = 0;
        do {
          iVar4 = piVar5[lVar12] * multiplicity + (int)uVar13;
          piVar6[uVar13] = iVar4;
          piVar10[iVar4] = (int)lVar9 + (int)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar8 != uVar13);
        lVar12 = lVar12 + 1;
        piVar6 = piVar6 + uVar8;
        lVar9 = lVar9 + uVar8;
      } while (lVar12 < dd->size);
    }
    iVar4 = dd->sizeZ;
    if (0 < (long)iVar4) {
      piVar5 = dd->invpermZ;
      ppDVar1 = dd->univ;
      lVar9 = 0;
      do {
        ppDVar1[lVar9]->index = piVar5[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar4 != lVar9);
    }
  }
  else {
    iVar4 = dd->sizeZ;
    piVar5 = (int *)malloc((long)iVar4 * 4);
    auVar3 = _DAT_0094e250;
    auVar2 = _DAT_0094e240;
    if (piVar5 == (int *)0x0) goto LAB_00802746;
    iVar7 = dd->size;
    if (0 < (long)iVar7) {
      piVar6 = dd->invperm;
      lVar9 = (ulong)(uint)multiplicity - 1;
      auVar15._8_4_ = (int)lVar9;
      auVar15._0_8_ = lVar9;
      auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar15 = auVar15 ^ _DAT_0094e250;
      piVar10 = piVar5;
      do {
        iVar11 = piVar6[lVar9] * multiplicity;
        lVar12 = 1;
        auVar17 = auVar2;
        do {
          auVar18 = auVar17 ^ auVar3;
          if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                      auVar15._4_4_ < auVar18._4_4_) & 1)) {
            piVar10[lVar12 + -1] = iVar11;
          }
          if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
              auVar18._12_4_ <= auVar15._12_4_) {
            piVar10[lVar12] = iVar11 + 1;
          }
          lVar14 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 2;
          auVar17._8_8_ = lVar14 + 2;
          lVar14 = lVar12 - (ulong)(multiplicity + 1U & 0xfffffffe);
          lVar12 = lVar12 + 2;
          iVar11 = iVar11 + 2;
        } while (lVar14 != -1);
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + (uint)multiplicity;
      } while (lVar9 != iVar7);
    }
    auVar3 = _DAT_0094e250;
    auVar2 = _DAT_0094e240;
    iVar7 = iVar7 * multiplicity;
    if (iVar7 < iVar4) {
      lVar9 = (long)iVar7;
      lVar12 = iVar4 - lVar9;
      lVar14 = lVar12 + -1;
      auVar18._8_4_ = (int)lVar14;
      auVar18._0_8_ = lVar14;
      auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar8 = 0;
      auVar18 = auVar18 ^ _DAT_0094e250;
      do {
        auVar16._8_4_ = (int)uVar8;
        auVar16._0_8_ = uVar8;
        auVar16._12_4_ = (int)(uVar8 >> 0x20);
        auVar15 = (auVar16 | auVar2) ^ auVar3;
        if ((bool)(~(auVar15._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar15._0_4_ ||
                    auVar18._4_4_ < auVar15._4_4_) & 1)) {
          piVar5[lVar9 + uVar8] = iVar7;
        }
        if ((auVar15._12_4_ != auVar18._12_4_ || auVar15._8_4_ <= auVar18._8_4_) &&
            auVar15._12_4_ <= auVar18._12_4_) {
          piVar5[lVar9 + uVar8 + 1] = iVar7 + 1;
        }
        uVar8 = uVar8 + 2;
        iVar7 = iVar7 + 2;
      } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar8);
    }
    iVar4 = Cudd_zddShuffleHeap(dd,piVar5);
    free(piVar5);
    if (iVar4 == 0) {
      return 0;
    }
  }
  if (dd->treeZ != (MtrNode *)0x0) {
    Mtr_FreeTree(dd->treeZ);
    dd->treeZ = (MtrNode *)0x0;
  }
  if (dd->tree == (MtrNode *)0x0) {
    if (multiplicity == 1) {
      return 1;
    }
    treenode = Mtr_InitGroupTree(0,dd->sizeZ);
    dd->treeZ = treenode;
    if (treenode == (MtrNode *)0x0) {
      return 0;
    }
    treenode->index = *dd->invpermZ;
  }
  else {
    treenode = Mtr_CopyTree(dd->tree,multiplicity);
    dd->treeZ = treenode;
    if (treenode == (MtrNode *)0x0) {
      return 0;
    }
    if (multiplicity == 1) {
      return 1;
    }
  }
  iVar4 = dd->size;
  __size = (size_t)iVar4;
  vmask = (char *)malloc(__size);
  if ((vmask != (char *)0x0) && (lmask = (char *)malloc(__size), lmask != (char *)0x0)) {
    if (0 < iVar4) {
      memset(lmask,0,__size);
      memset(vmask,0,__size);
    }
    iVar4 = addMultiplicityGroups(dd,treenode,multiplicity,vmask,lmask);
    free(vmask);
    free(lmask);
    return (uint)(iVar4 != 0);
  }
LAB_00802746:
  dd->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
Cudd_zddVarsFromBddVars(
  DdManager * dd /* DD manager */,
  int multiplicity /* how many ZDD variables are created for each BDD variable */)
{
    int res;
    int i, j;
    int allnew;
    int *permutation;

    if (multiplicity < 1) return(0);
    allnew = dd->sizeZ == 0;
    if (dd->size * multiplicity > dd->sizeZ) {
        res = cuddResizeTableZdd(dd,dd->size * multiplicity - 1);
        if (res == 0) return(0);
    }
    /* Impose the order of the BDD variables to the ZDD variables. */
    if (allnew) {
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                dd->permZ[i * multiplicity + j] =
                    dd->perm[i] * multiplicity + j;
                dd->invpermZ[dd->permZ[i * multiplicity + j]] =
                    i * multiplicity + j;
            }
        }
        for (i = 0; i < dd->sizeZ; i++) {
            dd->univ[i]->index = dd->invpermZ[i];
        }
    } else {
        permutation = ABC_ALLOC(int,dd->sizeZ);
        if (permutation == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                permutation[i * multiplicity + j] =
                    dd->invperm[i] * multiplicity + j;
            }
        }
        for (i = dd->size * multiplicity; i < dd->sizeZ; i++) {
            permutation[i] = i;
        }
        res = Cudd_zddShuffleHeap(dd, permutation);
        ABC_FREE(permutation);
        if (res == 0) return(0);
    }
    /* Copy and expand the variable group tree if it exists. */
    if (dd->treeZ != NULL) {
        Cudd_FreeZddTree(dd);
    }
    if (dd->tree != NULL) {
        dd->treeZ = Mtr_CopyTree(dd->tree, multiplicity);
        if (dd->treeZ == NULL) return(0);
    } else if (multiplicity > 1) {
        dd->treeZ = Mtr_InitGroupTree(0, dd->sizeZ);
        if (dd->treeZ == NULL) return(0);
        dd->treeZ->index = dd->invpermZ[0];
    }
    /* Create groups for the ZDD variables derived from the same BDD variable.
    */
    if (multiplicity > 1) {
        char *vmask, *lmask;

        vmask = ABC_ALLOC(char, dd->size);
        if (vmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        lmask =  ABC_ALLOC(char, dd->size);
        if (lmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            vmask[i] = lmask[i] = 0;
        }
        res = addMultiplicityGroups(dd,dd->treeZ,multiplicity,vmask,lmask);
        ABC_FREE(vmask);
        ABC_FREE(lmask);
        if (res == 0) return(0);
    }
    return(1);

}